

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<char_const(&)[8]>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          Type type,char *text,char (*args) [8])

{
  undefined4 in_register_0000000c;
  CompileMessage *args_00;
  CodeLocation local_38;
  char *local_28;
  char (*args_local) [8];
  char *text_local;
  Type type_local;
  Category category_local;
  
  args_local = (char (*) [8])CONCAT44(in_register_0000000c,type);
  text_local._4_4_ = SUB84(this,0);
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  args_00 = __return_storage_ptr__;
  local_28 = text;
  text_local._0_4_ = category;
  _type_local = __return_storage_ptr__;
  CodeLocation::CodeLocation(&local_38);
  createMessage<char_const(&)[8]>
            (__return_storage_ptr__,(CompileMessageHelpers *)((ulong)this & 0xffffffff),
             (Category)&local_38,(CodeLocation *)(ulong)(Category)text_local,(Type)args_local,
             local_28,(char (*) [8])args_00);
  CodeLocation::~CodeLocation(&local_38);
  return args_00;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }